

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall SCCTest_OneAndTwo_Test::TestBody(SCCTest_OneAndTwo_Test *this)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  __l_01;
  bool bVar1;
  char *message;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_1a0;
  AssertHelper local_168;
  Message local_160;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_155;
  less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_> local_154;
  undefined1 local_153;
  allocator<unsigned_int> local_152;
  less<unsigned_int> local_151;
  uint local_150 [2];
  iterator local_148;
  size_type local_140;
  allocator<unsigned_int> local_136;
  less<unsigned_int> local_135;
  uint local_134;
  iterator local_130;
  size_type local_128;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_120;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_118;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> local_e8;
  iterator local_b8;
  size_type local_b0;
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  local_a8;
  SCCSet local_78;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Graph_conflict1 graph;
  SCCTest_OneAndTwo_Test *this_local;
  
  graph.graph.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Graph::Graph((Graph *)local_28,3);
  Graph::addEdge((Graph *)local_28,0,1);
  Graph::addEdge((Graph *)local_28,1,2);
  Graph::addEdge((Graph *)local_28,2,1);
  getSCCs(&local_78,(Graph_conflict1 *)local_28);
  local_153 = 1;
  local_134 = 0;
  local_130 = &local_134;
  local_128 = 1;
  local_120 = &local_118;
  std::allocator<unsigned_int>::allocator(&local_136);
  __l_00._M_len = local_128;
  __l_00._M_array = local_130;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_118,__l_00,&local_135,&local_136);
  local_150[0] = 1;
  local_150[1] = 2;
  local_148 = local_150;
  local_140 = 2;
  local_120 = &local_e8;
  std::allocator<unsigned_int>::allocator(&local_152);
  __l._M_len = local_140;
  __l._M_array = local_148;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&local_e8,__l,&local_151,&local_152);
  local_153 = 0;
  local_b8 = &local_118;
  local_b0 = 2;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_155);
  __l_01._M_len = local_b0;
  __l_01._M_array = local_b8;
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::set(&local_a8,__l_01,&local_154,&local_155);
  testing::internal::EqHelper::
  Compare<std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_nullptr>
            ((EqHelper *)local_48,"getSCCs(graph)","(SCCSet{{0}, {1, 2}})",&local_78,&local_a8);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_a8);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_155);
  local_1a0 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_b8
  ;
  do {
    local_1a0 = local_1a0 + -1;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(local_1a0);
  } while (local_1a0 != &local_118);
  std::allocator<unsigned_int>::~allocator(&local_152);
  std::allocator<unsigned_int>::~allocator(&local_136);
  std::
  set<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~set(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/scc.cpp"
               ,0xe7,message);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  Graph::~Graph((Graph *)local_28);
  return;
}

Assistant:

TEST(SCCTest, OneAndTwo) {
  // 0 -> 1 <-> 2
  Graph graph(3);
  graph.addEdge(0, 1);
  graph.addEdge(1, 2);
  graph.addEdge(2, 1);
  EXPECT_EQ(getSCCs(graph), (SCCSet{{0}, {1, 2}}));
}